

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>
::~Stack(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>_>
         *this)

{
  int *piVar1;
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  *pIVar2;
  ulong uVar3;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  *pVVar4;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
  *pVVar5;
  
  pVVar4 = this->_stack;
  for (pVVar5 = this->_cursor; pVVar5 != pVVar4; pVVar5 = pVVar5 + -1) {
    pIVar2 = pVVar5[-1]._core;
    if (pIVar2 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                   *)0x0) {
      piVar1 = &pIVar2->_refCnt;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*pIVar2->_vptr_IteratorCore[1])(pIVar2);
        pVVar4 = this->_stack;
      }
    }
  }
  if (pVVar4 != (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
                 *)0x0) {
    uVar3 = this->_capacity * 8 + 0xf & 0xfffffffffffffff0;
    if (uVar3 == 0) {
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar4;
    }
    else if (uVar3 < 0x11) {
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar4;
    }
    else if (uVar3 < 0x19) {
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar4;
    }
    else if (uVar3 < 0x21) {
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar4;
    }
    else if (uVar3 < 0x31) {
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar4;
    }
    else {
      if (0x40 < uVar3) {
        operator_delete(pVVar4,0x10);
        return;
      }
      pVVar4->_core =
           (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_**>
            *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar4;
    }
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }